

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O3

void glu::TextureTestUtil::sampleTexture
               (SurfaceAccess *dst,TextureCubeArrayView *src,float *texCoord,ReferenceParams *params
               )

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  undefined8 uVar9;
  byte bVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  ulong uVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar31;
  float fVar32;
  float fVar33;
  undefined4 uVar34;
  undefined4 uVar35;
  float fVar36;
  float in_XMM9_Db;
  undefined4 in_XMM9_Dc;
  undefined4 in_XMM9_Dd;
  float fVar37;
  undefined1 auVar38 [16];
  TextureCubeArrayView TVar39;
  Vec3 triQ [2];
  Vec3 triR [2];
  Vec3 triT [2];
  Vec3 triS [2];
  TextureCubeArrayView src_1;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> srcLevelStorage;
  float local_1ec;
  Vec3 local_1d0;
  float local_1c0;
  float local_1bc;
  float local_1b8;
  float fStack_1b4;
  undefined8 uStack_1b0;
  undefined1 local_1a8 [16];
  float local_198 [8];
  float local_178 [8];
  float local_158 [3];
  int local_14c;
  float local_148;
  float local_144;
  float local_138 [8];
  float local_118;
  float fStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined1 local_108 [4];
  undefined8 uStack_104;
  float fStack_fc;
  undefined1 local_f8 [16];
  float local_e8;
  float fStack_e4;
  undefined8 uStack_e0;
  float local_d8;
  undefined4 uStack_d4;
  undefined8 uStack_d0;
  undefined4 local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  Vec3 local_88;
  Vec3 local_78;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> local_68;
  float local_48;
  undefined8 uStack_44;
  float fStack_3c;
  undefined8 local_38;
  
  local_e8 = *texCoord;
  fVar22 = texCoord[1];
  local_c8 = texCoord[4];
  local_1a8._0_4_ = texCoord[8];
  fVar23 = texCoord[0xc];
  local_118 = texCoord[5];
  local_98 = texCoord[9];
  local_d8 = texCoord[0xd];
  local_a8 = texCoord[2];
  fVar26 = texCoord[6];
  fVar24 = texCoord[10];
  local_b8 = texCoord[0xe];
  fVar36 = texCoord[3];
  fVar27 = texCoord[7];
  _local_1b8 = CONCAT44(fStack_1b4,texCoord[0xb]);
  fVar25 = texCoord[0xf];
  local_68.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  TVar39 = tcu::getEffectiveTextureView(src,&local_68,&params->sampler);
  local_f8._8_8_ = TVar39.m_levels;
  local_f8._0_4_ = TVar39.m_numLevels;
  iVar14 = dst->m_width;
  iVar19 = dst->m_height;
  local_138[0] = local_e8;
  local_138[1] = (float)local_c8;
  local_138[2] = (float)local_1a8._0_4_;
  local_138[3] = fVar23;
  local_138[4] = (float)local_1a8._0_4_;
  local_138[5] = (float)local_c8;
  local_158[0] = fVar22;
  local_158[1] = local_118;
  local_158[2] = local_98;
  local_14c = (int)local_d8;
  local_148 = local_98;
  local_144 = local_118;
  local_178[0] = local_a8;
  local_178[1] = fVar26;
  local_178[2] = fVar24;
  local_178[3] = local_b8;
  local_178[4] = fVar24;
  local_178[5] = fVar26;
  local_198[0] = fVar36;
  local_198[1] = fVar27;
  local_198[2] = local_1b8;
  local_198[3] = fVar25;
  local_198[4] = local_1b8;
  local_198[5] = fVar27;
  uStack_44._0_4_ = (params->super_RenderParams).w.m_data[1];
  uStack_44._4_4_ = (params->super_RenderParams).w.m_data[2];
  local_48 = (params->super_RenderParams).w.m_data[0];
  fStack_3c = (params->super_RenderParams).w.m_data[3];
  local_38 = CONCAT44((float)uStack_44,uStack_44._4_4_);
  local_1ec = 0.0;
  if (((params->super_RenderParams).flags & 2) != 0) {
    local_1ec = (params->super_RenderParams).bias;
  }
  if (0 < iVar19) {
    fVar22 = (float)iVar14;
    fVar23 = (float)iVar19;
    iVar20 = 0;
    do {
      if (0 < iVar14) {
        fVar24 = (float)iVar20 + 0.5;
        local_1bc = fVar24 / fVar23;
        local_1c0 = 1.0 - local_1bc;
        iVar19 = 0;
        fVar26 = in_XMM9_Db;
        uVar34 = in_XMM9_Dc;
        uVar35 = in_XMM9_Dd;
        do {
          fVar36 = (float)iVar19 + 0.5;
          local_118 = fVar36 / fVar22;
          bVar11 = 1.0 <= local_1bc + local_118;
          local_c8 = local_1bc;
          if (bVar11) {
            local_118 = 1.0 - local_118;
            fVar26 = 0.0;
            uVar34 = 0;
            uVar35 = 0;
            local_c8 = local_1c0;
          }
          uVar13 = (ulong)bVar11;
          fVar27 = local_178[uVar13 * 3];
          fVar25 = local_178[uVar13 * 3 + 1];
          fVar1 = local_178[uVar13 * 3 + 2];
          local_1d0.m_data[2] =
               (fVar25 - fVar27) * (float)local_c8 + (fVar1 - fVar27) * local_118 + fVar27;
          fVar2 = local_158[uVar13 * 3];
          fVar3 = local_158[uVar13 * 3 + 1];
          fVar4 = local_158[uVar13 * 3 + 2];
          fVar5 = local_138[uVar13 * 3];
          fVar6 = local_138[uVar13 * 3 + 1];
          uStack_d4 = fVar3;
          local_d8 = fVar6;
          fVar7 = local_138[uVar13 * 3 + 2];
          uStack_1b0 = 0;
          uVar9 = *(undefined8 *)((long)&uStack_44 + uVar13 * 0xc);
          fVar31 = (float)uVar9;
          in_XMM9_Db = (float)((ulong)uVar9 >> 0x20);
          local_98 = (fVar5 - fVar7) * fVar31;
          fStack_94 = (fVar2 - fVar4) * fVar31;
          fStack_90 = fVar31 * 0.0;
          fStack_8c = fVar31 * 0.0;
          local_b8 = fVar31 * (fVar7 - fVar5);
          fStack_b4 = fVar31 * (fVar4 - fVar2);
          fStack_b0 = fVar31 * 0.0;
          fStack_ac = fVar31 * 0.0;
          uStack_d0 = 0;
          local_1d0.m_data[1] =
               (fVar3 - fVar2) * (float)local_c8 + (fVar4 - fVar2) * local_118 + fVar2;
          local_1d0.m_data[0] =
               (fVar6 - fVar5) * (float)local_c8 + (fVar7 - fVar5) * local_118 + fVar5;
          fVar32 = (float)local_c8 + -1.0;
          in_XMM9_Dc = 0;
          in_XMM9_Dd = 0;
          fVar28 = fVar31 * in_XMM9_Db;
          fStack_e4 = in_XMM9_Db;
          local_e8 = fVar28;
          uStack_e0._0_1_ = false;
          uStack_e0._1_3_ = 0;
          uStack_e0._4_4_ = COMPAREMODE_NONE;
          fVar8 = (&local_48)[uVar13 * 3];
          fVar37 = fVar31 * fVar8 * in_XMM9_Db;
          fVar33 = (fVar22 * fVar32 + fVar36) * fVar28 -
                   (in_XMM9_Db * fVar22 * (float)local_c8 + fVar36 * fVar31) * fVar8;
          local_1a8 = ZEXT416((uint)local_c8);
          fVar36 = fVar37 * fVar22;
          auVar29._0_4_ =
               fVar36 * (fVar32 * local_98 +
                        ((fVar6 - fVar5) * in_XMM9_Db + (fVar7 - fVar6) * fVar8) * (float)local_c8);
          auVar29._4_4_ =
               fVar36 * (fVar32 * fStack_94 +
                        ((fVar3 - fVar2) * in_XMM9_Db + (fVar4 - fVar3) * fVar8) * (float)local_c8);
          auVar29._8_4_ =
               in_XMM9_Db * (fStack_90 * 0.0 + (in_XMM9_Db * 0.0 + fVar8 * 0.0) * (float)local_c8);
          auVar29._12_4_ =
               in_XMM9_Db * (fStack_8c * 0.0 + (in_XMM9_Db * 0.0 + fVar8 * 0.0) * (float)local_c8);
          fVar33 = fVar33 * fVar33;
          local_78.m_data[2] =
               (((fVar27 - fVar1) * fVar31 * fVar32 +
                ((fVar25 - fVar27) * in_XMM9_Db + (fVar1 - fVar25) * fVar8) * (float)local_c8) *
               fVar36) / fVar33;
          auVar12._4_4_ = fVar33;
          auVar12._0_4_ = fVar33;
          auVar12._8_8_ = 0;
          auVar30 = divps(auVar29,auVar12);
          local_78.m_data._0_8_ = auVar30._0_8_;
          fVar32 = local_118 + -1.0;
          fVar36 = (fVar23 * fVar32 + fVar24) * fVar28 -
                   (fVar31 * fVar23 * local_118 + fVar24 * in_XMM9_Db) * fVar8;
          fVar37 = fVar37 * fVar23;
          auVar38._0_4_ =
               fVar37 * (fVar32 * (fVar5 - fVar6) * in_XMM9_Db +
                        ((fVar6 - fVar7) * fVar8 + local_b8) * local_118);
          auVar38._4_4_ =
               fVar37 * (fVar32 * (fVar2 - fVar3) * in_XMM9_Db +
                        ((fVar3 - fVar4) * fVar8 + fStack_b4) * local_118);
          auVar38._8_4_ =
               in_XMM9_Db * (fVar26 * in_XMM9_Db * 0.0 + (fVar8 * 0.0 + fStack_b0) * local_118);
          auVar38._12_4_ =
               in_XMM9_Db * (fVar26 * in_XMM9_Db * 0.0 + (fVar8 * 0.0 + fStack_ac) * local_118);
          fVar36 = fVar36 * fVar36;
          local_88.m_data[2] =
               (((fVar27 - fVar25) * in_XMM9_Db * fVar32 +
                ((fVar25 - fVar1) * fVar8 + (fVar1 - fVar27) * fVar31) * local_118) * fVar37) /
               fVar36;
          auVar30._4_4_ = fVar36;
          auVar30._0_4_ = fVar36;
          auVar30._8_8_ = 0;
          auVar30 = divps(auVar38,auVar30);
          _local_1b8 = CONCAT44(fVar4,local_198[uVar13 * 3]);
          local_88.m_data._0_8_ = auVar30._0_8_;
          fVar36 = local_198[uVar13 * 3 + 1];
          fVar27 = local_198[uVar13 * 3 + 2];
          if ((int)local_f8._0_4_ < 1) {
            iVar14 = 0;
          }
          else {
            iVar14 = ((IVec3 *)(local_f8._8_8_ + 8))->m_data[0];
          }
          fStack_114 = fVar26;
          uStack_110 = uVar34;
          uStack_10c = uVar35;
          fStack_c4 = (float)local_c8;
          fStack_c0 = (float)local_c8;
          fStack_bc = (float)local_c8;
          local_a8 = local_118;
          fStack_a4 = local_118;
          fStack_a0 = local_118;
          fStack_9c = local_118;
          fVar25 = computeCubeLodFromDerivates
                             (params->lodMode,&local_1d0,&local_78,&local_88,iVar14);
          fVar36 = (fVar36 - local_1b8) * (float)local_1a8._0_4_ +
                   (fVar27 - local_1b8) * local_118 + local_1b8;
          fVar25 = fVar25 + local_1ec;
          fVar26 = params->maxLod;
          if (fVar25 <= params->maxLod) {
            fVar26 = fVar25;
          }
          uVar21 = -(uint)(fVar25 < params->minLod);
          fVar26 = (float)(uVar21 & (uint)params->minLod | ~uVar21 & (uint)fVar26);
          if ((params->super_RenderParams).samplerType == SAMPLERTYPE_SHADOW) {
            local_108 = (undefined1  [4])
                        tcu::TextureCubeArrayView::sampleCompare
                                  ((TextureCubeArrayView *)local_f8,&params->sampler,
                                   (params->super_RenderParams).ref,local_1d0.m_data[0],
                                   local_1d0.m_data[1],local_1d0.m_data[2],fVar36,fVar26);
            uStack_104 = 0;
            fStack_fc = 1.0;
          }
          else {
            tcu::TextureCubeArrayView::sample
                      ((TextureCubeArrayView *)local_108,(Sampler *)local_f8,local_1d0.m_data[0],
                       local_1d0.m_data[1],local_1d0.m_data[2],fVar36,fVar26);
          }
          fVar26 = (params->super_RenderParams).colorScale.m_data[0] * (float)local_108 +
                   (params->super_RenderParams).colorBias.m_data[0];
          fVar36 = (params->super_RenderParams).colorScale.m_data[1] * (float)uStack_104 +
                   (params->super_RenderParams).colorBias.m_data[1];
          fVar27 = (params->super_RenderParams).colorScale.m_data[2] * uStack_104._4_4_ +
                   (params->super_RenderParams).colorBias.m_data[2];
          fVar25 = (params->super_RenderParams).colorScale.m_data[3] * fStack_fc +
                   (params->super_RenderParams).colorBias.m_data[3];
          bVar10 = dst->m_colorMask;
          uVar15 = 0;
          uVar21 = 0;
          if ((bVar10 & 1) != 0) {
            uVar16 = 0x7e - ((int)fVar26 >> 0x17);
            uVar21 = (((uint)fVar26 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar16 & 0x1f)) +
                     0x800000;
            if (8 < uVar16) {
              uVar21 = uVar16;
            }
            uVar21 = uVar21 >> 0x18;
          }
          if ((bVar10 & 2) != 0) {
            uVar16 = 0x7e - ((int)fVar36 >> 0x17);
            uVar15 = (((uint)fVar36 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar16 & 0x1f)) +
                     0x800000;
            if (8 < uVar16) {
              uVar15 = uVar16;
            }
            uVar15 = uVar15 >> 0x10 & 0xff00;
          }
          uVar16 = 0;
          if ((bVar10 & 4) != 0) {
            uVar17 = 0x7e - ((int)fVar27 >> 0x17);
            uVar16 = (((uint)fVar27 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar17 & 0x1f)) +
                     0x800000;
            if (8 < uVar17) {
              uVar16 = uVar17;
            }
            uVar16 = uVar16 >> 8 & 0xff0000;
          }
          uVar17 = 0xff000000;
          if ((bVar10 & 8) != 0) {
            uVar18 = 0x7e - ((int)fVar25 >> 0x17);
            uVar17 = (((uint)fVar25 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar18 & 0x1f)) +
                     0x800000;
            if (8 < uVar18) {
              uVar17 = uVar18;
            }
            uVar17 = uVar17 & 0xff000000;
          }
          *(uint *)((long)(dst->m_surface->m_pixels).m_ptr +
                   (long)(dst->m_x + iVar19 + (dst->m_y + iVar20) * dst->m_surface->m_width) * 4) =
               uVar15 | uVar21 | uVar16 | uVar17;
          iVar19 = iVar19 + 1;
          iVar14 = dst->m_width;
          fVar26 = in_XMM9_Db;
          uVar34 = in_XMM9_Dc;
          uVar35 = in_XMM9_Dd;
        } while (iVar19 < iVar14);
        iVar19 = dst->m_height;
      }
      iVar20 = iVar20 + 1;
    } while (iVar20 < iVar19);
  }
  if (local_68.
      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void sampleTexture (const tcu::SurfaceAccess& dst, const tcu::TextureCubeArrayView& src, const float* texCoord, const ReferenceParams& params)
{
	tcu::Vec4 sq = tcu::Vec4(texCoord[0+0], texCoord[4+0], texCoord[8+0], texCoord[12+0]);
	tcu::Vec4 tq = tcu::Vec4(texCoord[0+1], texCoord[4+1], texCoord[8+1], texCoord[12+1]);
	tcu::Vec4 rq = tcu::Vec4(texCoord[0+2], texCoord[4+2], texCoord[8+2], texCoord[12+2]);
	tcu::Vec4 qq = tcu::Vec4(texCoord[0+3], texCoord[4+3], texCoord[8+3], texCoord[12+3]);

	sampleTextureCubeArray(dst, src, sq, tq, rq, qq, params);
}